

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

int INT_CMCondition_has_signaled(CManager cm,int condition)

{
  int iVar1;
  CMCondition p_Var2;
  
  p_Var2 = (CMCondition)&cm->control_list->condition_list;
  set_debug_flag(cm);
  do {
    p_Var2 = p_Var2->next;
    if (p_Var2 == (CMCondition)0x0) {
      p_Var2 = (CMCondition)0x0;
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              condition);
      break;
    }
  } while (p_Var2->condition_num != condition);
  if (p_Var2 == (CMCondition)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = p_Var2->signaled;
  }
  return iVar1;
}

Assistant:

extern int
INT_CMCondition_has_signaled(CManager cm, int condition)
{
    int retval;
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);

    cond = CMCondition_find(cl, condition);
    if (!cond) return -1;
    retval = cond->signaled;
    
    return retval;
}